

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O0

void __thiscall Js::BoundFunction::ProcessCorePaths(BoundFunction *this)

{
  RuntimeContextInfo *pRVar1;
  ScriptContext *pSVar2;
  RecyclableObject **ppRVar3;
  void **ppvVar4;
  BoundFunction *this_local;
  
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pRVar1 = pSVar2->TTDWellKnownInfo;
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->targetFunction);
  TTD::RuntimeContextInfo::EnqueueNewPathVarAsNeeded
            (pRVar1,(RecyclableObject *)this,*ppRVar3,L"!targetFunction",(char16 *)0x0);
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pRVar1 = pSVar2->TTDWellKnownInfo;
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->boundThis);
  TTD::RuntimeContextInfo::EnqueueNewPathVarAsNeeded
            (pRVar1,(RecyclableObject *)this,*ppvVar4,L"!boundThis",(char16 *)0x0);
  if (this->count != 0) {
    TTDAbort_unrecoverable_error("Should only have empty args in core image");
  }
  return;
}

Assistant:

void BoundFunction::ProcessCorePaths()
    {
        this->GetScriptContext()->TTDWellKnownInfo->EnqueueNewPathVarAsNeeded(this, this->targetFunction, _u("!targetFunction"));
        this->GetScriptContext()->TTDWellKnownInfo->EnqueueNewPathVarAsNeeded(this, this->boundThis, _u("!boundThis"));

        TTDAssert(this->count == 0, "Should only have empty args in core image");
    }